

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quass.cpp
# Opt level: O1

void loginformation(Runtime *rt,Basis *basis,CholeskyFactor *factor,HighsTimer *timer)

{
  Statistics *pSVar1;
  iterator iVar2;
  iterator iVar3;
  int iVar4;
  size_t __nbytes;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  double extraout_XMM0_Qa;
  SumNum SVar5;
  double local_40;
  int local_38 [2];
  double local_30;
  
  pSVar1 = rt->statistics;
  iVar2._M_current =
       (pSVar1->iteration).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pSVar1->iteration).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&pSVar1->iteration,iVar2,&pSVar1->num_iterations);
  }
  else {
    *iVar2._M_current = pSVar1->num_iterations;
    (pSVar1->iteration).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  pSVar1 = rt->statistics;
  __nbytes = (ulong)((long)(basis->active_constraint_index).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(basis->active_constraint_index).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
  iVar4 = (rt->instance).num_var - (int)__nbytes;
  local_40 = (double)CONCAT44(local_40._4_4_,iVar4);
  iVar2._M_current =
       (pSVar1->nullspacedimension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pSVar1->nullspacedimension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&pSVar1->nullspacedimension,iVar2,(int *)&local_40);
  }
  else {
    *iVar2._M_current = iVar4;
    (pSVar1->nullspacedimension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  pSVar1 = rt->statistics;
  local_40 = Instance::objval(&rt->instance,&rt->primal);
  iVar3._M_current =
       (pSVar1->objval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (pSVar1->objval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&pSVar1->objval,iVar3,&local_40);
    __buf = extraout_RDX_00;
  }
  else {
    *iVar3._M_current = local_40;
    (pSVar1->objval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    __buf = extraout_RDX;
  }
  pSVar1 = rt->statistics;
  HighsTimer::read(timer,0,__buf,__nbytes);
  iVar3._M_current =
       (pSVar1->time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (pSVar1->time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&pSVar1->time,iVar3,&local_40);
  }
  else {
    *iVar3._M_current = extraout_XMM0_Qa;
    (pSVar1->time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  SVar5 = Instance::sumnumprimalinfeasibilities(&rt->instance,&rt->primal,&rt->rowactivity);
  local_40 = SVar5.sum;
  local_38[0] = SVar5.num;
  pSVar1 = rt->statistics;
  iVar3._M_current =
       (pSVar1->sum_primal_infeasibilities).super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (pSVar1->sum_primal_infeasibilities).super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&pSVar1->sum_primal_infeasibilities,iVar3,
               &local_40);
  }
  else {
    *iVar3._M_current = local_40;
    (pSVar1->sum_primal_infeasibilities).super__Vector_base<double,_std::allocator<double>_>._M_impl
    .super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  pSVar1 = rt->statistics;
  iVar2._M_current =
       (pSVar1->num_primal_infeasibilities).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pSVar1->num_primal_infeasibilities).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&pSVar1->num_primal_infeasibilities,iVar2,local_38
              );
  }
  else {
    *iVar2._M_current = local_38[0];
    (pSVar1->num_primal_infeasibilities).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  pSVar1 = rt->statistics;
  local_30 = CholeskyFactor::density(factor);
  iVar3._M_current =
       (pSVar1->density_factor).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (pSVar1->density_factor).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&pSVar1->density_factor,iVar3,&local_30);
  }
  else {
    *iVar3._M_current = local_30;
    (pSVar1->density_factor).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  pSVar1 = rt->statistics;
  local_30 = 0.0;
  iVar3._M_current =
       (pSVar1->density_nullspace).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (pSVar1->density_nullspace).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&pSVar1->density_nullspace,iVar3,&local_30);
  }
  else {
    *iVar3._M_current = 0.0;
    (pSVar1->density_nullspace).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  return;
}

Assistant:

static void loginformation(Runtime& rt, Basis& basis, CholeskyFactor& factor,
                           HighsTimer& timer) {
  rt.statistics.iteration.push_back(rt.statistics.num_iterations);
  rt.statistics.nullspacedimension.push_back(rt.instance.num_var -
                                             basis.getnumactive());
  rt.statistics.objval.push_back(rt.instance.objval(rt.primal));
  rt.statistics.time.push_back(timer.read());
  SumNum sm =
      rt.instance.sumnumprimalinfeasibilities(rt.primal, rt.rowactivity);
  rt.statistics.sum_primal_infeasibilities.push_back(sm.sum);
  rt.statistics.num_primal_infeasibilities.push_back(sm.num);
  rt.statistics.density_factor.push_back(factor.density());
  rt.statistics.density_nullspace.push_back(0.0);
}